

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *templateString,
          FormatArgumentList *args)

{
  allocator<char> local_59;
  StringTemplate local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,(char *)this,&local_59);
  tcu::StringTemplate::StringTemplate(&local_58,&local_38);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,&local_58,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)templateString);
  tcu::StringTemplate::~StringTemplate(&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatGLSL (const char* templateString, const FormatArgumentList& args)
{
	const std::map<std::string, std::string>& params = args.getArguments();

	return tcu::StringTemplate(std::string(templateString)).specialize(params);
}